

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

void __thiscall
duckdb::Logger::WriteLog(Logger *this,char *log_type,LogLevel log_level,string_t *message)

{
  undefined7 in_register_00000011;
  string copied_string;
  string local_40;
  
  string_t::GetString_abi_cxx11_(&local_40,message);
  (*this->_vptr_Logger[3])
            (this,log_type,CONCAT71(in_register_00000011,log_level) & 0xffffffff,
             local_40._M_dataplus._M_p);
  ::std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Logger::WriteLog(const char *log_type, LogLevel log_level, const string_t &message) {
	string copied_string = message.GetString();
	WriteLog(log_type, log_level, copied_string.c_str());
}